

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emitterutils.cpp
# Opt level: O0

Error asmjit::v1_14::EmitterUtils::logInstructionFailed
                (BaseEmitter *self,Error err,InstId instId,InstOptions options,Operand_ *o0,
                Operand_ *o1,Operand_ *o2,Operand_ *opExt)

{
  Error EVar1;
  undefined4 in_ECX;
  undefined4 in_EDX;
  Error in_ESI;
  long in_RDI;
  Operand_ *in_R8;
  Operand_ *in_R9;
  Operand_ *in_stack_00000008;
  Operand_ *in_stack_00000010;
  Operand_ opArray [6];
  StringTmp<256UL> sb;
  StringTmp<256UL> *this;
  char *in_stack_fffffffffffffce0;
  Error in_stack_fffffffffffffcec;
  size_t in_stack_fffffffffffffcf0;
  char *in_stack_fffffffffffffcf8;
  ModifyOp in_stack_fffffffffffffd04;
  String *in_stack_fffffffffffffd08;
  undefined4 local_2d8;
  undefined4 local_2d4;
  undefined8 local_2d0;
  Operand_ local_2c8 [6];
  StringTmp<256UL> local_268;
  undefined1 auStack_267 [295];
  Operand_ *local_140;
  Operand_ *local_138;
  undefined4 local_12c;
  undefined4 local_128;
  Error local_124;
  long local_120;
  undefined8 local_118;
  undefined8 local_110;
  StringTmp<256UL> *local_108;
  undefined8 local_100;
  char *local_f8;
  StringTmp<256UL> *local_f0;
  undefined8 local_e8;
  char *local_e0;
  StringTmp<256UL> *local_d8;
  undefined8 local_d0;
  char *local_c8;
  StringTmp<256UL> *local_c0;
  StringTmp<256UL> *local_b8;
  StringTmp<256UL> *local_b0;
  long local_a8;
  long local_a0;
  undefined8 *local_98;
  undefined4 local_90;
  undefined4 local_8c;
  undefined4 *local_88;
  long local_80;
  long local_78;
  long local_70;
  StringTmp<256UL> *local_68;
  long local_60;
  undefined1 *local_58;
  long local_50;
  long local_48;
  long local_40;
  undefined4 local_34;
  undefined4 *local_30;
  undefined4 local_24;
  undefined4 *local_20;
  undefined4 *local_18;
  undefined4 local_10;
  undefined4 local_c;
  StringTmp<256UL> *local_8;
  
  local_140 = in_R9;
  local_138 = in_R8;
  local_12c = in_ECX;
  local_128 = in_EDX;
  local_124 = in_ESI;
  local_120 = in_RDI;
  local_b0 = &local_268;
  local_8 = &local_268;
  memset(&local_268,0,0x20);
  StringTmp<256UL>::_resetToTemporary(&local_268);
  local_c8 = DebugUtils::errorAsString(local_124);
  local_c0 = &local_268;
  local_d0 = 0xffffffffffffffff;
  String::_opString(in_stack_fffffffffffffd08,in_stack_fffffffffffffd04,in_stack_fffffffffffffcf8,
                    in_stack_fffffffffffffcf0);
  local_d8 = &local_268;
  local_e0 = ": ";
  local_e8 = 0xffffffffffffffff;
  String::_opString(in_stack_fffffffffffffd08,in_stack_fffffffffffffd04,in_stack_fffffffffffffcf8,
                    in_stack_fffffffffffffcf0);
  opArrayFromEmitArgs(local_2c8,local_138,local_140,in_stack_00000008,in_stack_00000010);
  local_a8 = local_120;
  local_60 = local_120;
  local_58 = (undefined1 *)(local_120 + 0x48);
  local_a0 = local_120;
  local_98 = (undefined8 *)(local_120 + 0x58);
  local_88 = &local_2d8;
  local_8c = local_128;
  local_90 = local_12c;
  local_2d8 = local_128;
  local_2d4 = local_12c;
  local_2d0 = *local_98;
  this = (StringTmp<256UL> *)0x6;
  (**(code **)(local_120 + 0x80))(&local_268,0x40,local_120,*local_58,&local_2d8,local_2c8);
  local_78 = local_120;
  if (*(long *)(local_120 + 0x60) != 0) {
    local_f0 = &local_268;
    local_f8 = " ; ";
    local_100 = 0xffffffffffffffff;
    String::_opString(in_stack_fffffffffffffd08,in_stack_fffffffffffffd04,in_stack_fffffffffffffcf8,
                      in_stack_fffffffffffffcf0);
    local_80 = local_120;
    local_110 = *(undefined8 *)(local_120 + 0x60);
    local_108 = &local_268;
    local_118 = 0xffffffffffffffff;
    String::_opString(in_stack_fffffffffffffd08,in_stack_fffffffffffffd04,in_stack_fffffffffffffcf8,
                      in_stack_fffffffffffffcf0);
  }
  local_70 = local_120;
  local_50 = local_120;
  *(undefined4 *)(local_120 + 0x54) = 0;
  local_48 = local_120;
  local_30 = (undefined4 *)(local_120 + 0x58);
  local_10 = 0;
  local_c = 0;
  local_34 = 0;
  local_20 = &local_34;
  local_24 = 0;
  *local_30 = 0;
  *(undefined4 *)(local_120 + 0x5c) = 0;
  local_40 = local_120;
  *(undefined8 *)(local_120 + 0x60) = 0;
  local_b8 = &local_268;
  if ((byte)local_268 < 0x1f) {
    auStack_267._23_8_ = auStack_267;
  }
  local_68 = local_b8;
  local_18 = local_30;
  EVar1 = BaseEmitter::reportError
                    ((BaseEmitter *)auStack_267._23_8_,in_stack_fffffffffffffcec,
                     in_stack_fffffffffffffce0);
  StringTmp<256UL>::~StringTmp(this);
  return EVar1;
}

Assistant:

Error logInstructionFailed(
  BaseEmitter* self,
  Error err,
  InstId instId,
  InstOptions options,
  const Operand_& o0, const Operand_& o1, const Operand_& o2, const Operand_* opExt) {

  StringTmp<256> sb;
  sb.append(DebugUtils::errorAsString(err));
  sb.append(": ");

  Operand_ opArray[Globals::kMaxOpCount];
  opArrayFromEmitArgs(opArray, o0, o1, o2, opExt);

  self->_funcs.formatInstruction(sb, FormatFlags::kRegType, self, self->arch(), BaseInst(instId, options, self->extraReg()), opArray, Globals::kMaxOpCount);

  if (self->inlineComment()) {
    sb.append(" ; ");
    sb.append(self->inlineComment());
  }

  self->resetState();
  return self->reportError(err, sb.data());
}